

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PropValidator::
getHumanReadablePropertyString_abi_cxx11_(string *__return_storage_ptr__,void *this,GLint propVal)

{
  GLint local_c;
  
  local_c = propVal;
  de::toString<int>(__return_storage_ptr__,&local_c);
  return __return_storage_ptr__;
}

Assistant:

std::string PropValidator::getHumanReadablePropertyString (glw::GLint propVal) const
{
	return de::toString(propVal);
}